

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

size_t al_fread(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  long lVar1;
  int iVar2;
  long in_RDX;
  undefined1 *in_RSI;
  long *in_RDI;
  uchar *cptr;
  int bytes_ungetc;
  undefined1 *local_30;
  int local_24;
  long local_20;
  size_t local_8;
  
  if ((int)in_RDI[4] == 0) {
    local_8 = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI,in_RDX);
  }
  else {
    local_24 = 0;
    local_30 = in_RSI;
    for (local_20 = in_RDX; 0 < (int)in_RDI[4] && local_20 != 0; local_20 = local_20 + -1) {
      iVar2 = (int)in_RDI[4] + -1;
      *(int *)(in_RDI + 4) = iVar2;
      *local_30 = *(undefined1 *)((long)in_RDI + (long)iVar2 + 0x10);
      local_24 = local_24 + 1;
      local_30 = local_30 + 1;
    }
    lVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_30,local_20);
    local_8 = local_24 + lVar1;
  }
  return local_8;
}

Assistant:

size_t al_fread(ALLEGRO_FILE *f, void *ptr, size_t size)
{
   ASSERT(f);
   ASSERT(ptr || size == 0);

   if (f->ungetc_len) {
      int bytes_ungetc = 0;
      unsigned char *cptr = ptr;

      while (f->ungetc_len > 0 && size > 0) {
         *cptr++ = f->ungetc[--f->ungetc_len];
         ++bytes_ungetc;
         --size;
      }

      return bytes_ungetc + f->vtable->fi_fread(f, cptr, size);
   }
   else {
      return f->vtable->fi_fread(f, ptr, size);
   }
}